

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O1

void dlib::blas_bindings::
     matrix_assign_blas_helper<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,void>
     ::
     assign<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
               *src,type alpha,bool add_to,bool transpose)

{
  size_t __n;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  byte bVar16;
  byte bVar17;
  float *pfVar18;
  float *pfVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ushort uVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar31 [16];
  matrix_type temp;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_70;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
  local_50;
  type local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
  local_38;
  
  if ((alpha != 1.0) || (NAN(alpha))) {
    local_48 = alpha;
    uStack_44 = in_XMM0_Db;
    uStack_40 = in_XMM0_Dc;
    uStack_3c = in_XMM0_Dd;
    if (add_to) {
      matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
      matrix(&local_70,dest->height,dest->width);
      lVar22 = local_70.data.nc_;
      if (0 < local_70.data.nr_) {
        __n = local_70.data.nc_ * 4;
        lVar23 = local_70.data.nr_;
        pfVar19 = local_70.data.data;
        do {
          if (0 < lVar22) {
            memset(pfVar19,0,__n);
          }
          pfVar19 = pfVar19 + lVar22;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      if (transpose) {
        local_50.op.m =
             (op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
              )src->rhs;
        local_38.op.m =
             (op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
              )src->lhs;
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                  (&local_70,&local_50,&local_38);
        auVar31._4_4_ = uStack_44;
        auVar31._0_4_ = local_48;
        auVar31._8_4_ = uStack_40;
        auVar31._12_4_ = uStack_3c;
      }
      else {
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (&local_70,src->lhs,src->rhs);
        auVar31._4_4_ = uStack_44;
        auVar31._0_4_ = local_48;
        auVar31._8_4_ = uStack_40;
        auVar31._12_4_ = uStack_3c;
      }
      if ((auVar31._0_4_ != -1.0) || (NAN(auVar31._0_4_))) {
        if (0 < local_70.data.nr_) {
          pfVar19 = dest->ptr;
          lVar22 = dest->width;
          lVar23 = 0;
          pfVar18 = local_70.data.data;
          do {
            if (0 < local_70.data.nc_) {
              lVar21 = 0;
              do {
                auVar15 = vfmadd213ss_fma(ZEXT416((uint)pfVar18[lVar21]),auVar31,
                                          ZEXT416((uint)pfVar19[lVar21]));
                pfVar19[lVar21] = auVar15._0_4_;
                lVar21 = lVar21 + 1;
              } while (local_70.data.nc_ != lVar21);
            }
            lVar23 = lVar23 + 1;
            pfVar19 = pfVar19 + lVar22;
            pfVar18 = pfVar18 + local_70.data.nc_;
          } while (lVar23 != local_70.data.nr_);
        }
      }
      else if (0 < local_70.data.nr_) {
        pfVar19 = dest->ptr;
        lVar22 = dest->width;
        lVar23 = 0;
        pfVar18 = local_70.data.data;
        do {
          if (0 < local_70.data.nc_) {
            lVar21 = 0;
            do {
              pfVar19[lVar21] = pfVar19[lVar21] - pfVar18[lVar21];
              lVar21 = lVar21 + 1;
            } while (local_70.data.nc_ != lVar21);
          }
          lVar23 = lVar23 + 1;
          pfVar19 = pfVar19 + lVar22;
          pfVar18 = pfVar18 + local_70.data.nc_;
        } while (lVar23 != local_70.data.nr_);
      }
      if (local_70.data.data != (float *)0x0) {
        operator_delete__(local_70.data.data);
      }
    }
    else {
      lVar22 = dest->height;
      if (0 < lVar22) {
        pfVar19 = dest->ptr;
        lVar23 = dest->width;
        do {
          if (0 < lVar23) {
            memset(pfVar19,0,lVar23 * 4);
          }
          pfVar19 = pfVar19 + lVar23;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      if (transpose) {
        local_70.data.data = (float *)src->rhs;
        local_50.op.m =
             (op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
              )src->lhs;
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                  (dest,(matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                         *)&local_70,&local_50);
      }
      else {
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (dest,src->lhs,src->rhs);
      }
      lVar22 = dest->height;
      auVar15._4_4_ = uStack_44;
      auVar15._0_4_ = local_48;
      auVar15._8_4_ = uStack_40;
      auVar15._12_4_ = uStack_3c;
      if (0 < lVar22) {
        pfVar19 = dest->ptr;
        lVar23 = dest->width;
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vbroadcastss_avx512f(auVar15);
        lVar21 = 0;
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          if (0 < lVar23) {
            uVar20 = 0;
            do {
              auVar29 = vpbroadcastq_avx512f();
              auVar30 = vporq_avx512f(auVar29,auVar27);
              auVar29 = vporq_avx512f(auVar29,auVar28);
              uVar14 = vpcmpuq_avx512f(auVar29,auVar25,2);
              bVar16 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar30,auVar25,2);
              bVar17 = (byte)uVar14;
              uVar24 = CONCAT11(bVar17,bVar16);
              pfVar18 = pfVar19 + uVar20;
              auVar29._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * (int)pfVar18[1];
              auVar29._0_4_ = (uint)(bVar16 & 1) * (int)*pfVar18;
              auVar29._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * (int)pfVar18[2];
              auVar29._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * (int)pfVar18[3];
              auVar29._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * (int)pfVar18[4];
              auVar29._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * (int)pfVar18[5];
              auVar29._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * (int)pfVar18[6];
              auVar29._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * (int)pfVar18[7];
              auVar29._32_4_ = (uint)(bVar17 & 1) * (int)pfVar18[8];
              auVar29._36_4_ = (uint)(bVar17 >> 1 & 1) * (int)pfVar18[9];
              auVar29._40_4_ = (uint)(bVar17 >> 2 & 1) * (int)pfVar18[10];
              auVar29._44_4_ = (uint)(bVar17 >> 3 & 1) * (int)pfVar18[0xb];
              auVar29._48_4_ = (uint)(bVar17 >> 4 & 1) * (int)pfVar18[0xc];
              auVar29._52_4_ = (uint)(bVar17 >> 5 & 1) * (int)pfVar18[0xd];
              auVar29._56_4_ = (uint)(bVar17 >> 6 & 1) * (int)pfVar18[0xe];
              auVar29._60_4_ = (uint)(bVar17 >> 7) * (int)pfVar18[0xf];
              auVar29 = vmulps_avx512f(auVar29,auVar26);
              pfVar18 = pfVar19 + uVar20;
              bVar1 = (bool)((byte)(uVar24 >> 1) & 1);
              bVar2 = (bool)((byte)(uVar24 >> 2) & 1);
              bVar3 = (bool)((byte)(uVar24 >> 3) & 1);
              bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
              bVar5 = (bool)((byte)(uVar24 >> 5) & 1);
              bVar6 = (bool)((byte)(uVar24 >> 6) & 1);
              bVar7 = (bool)((byte)(uVar24 >> 7) & 1);
              bVar8 = (bool)(bVar17 >> 1 & 1);
              bVar9 = (bool)(bVar17 >> 2 & 1);
              bVar10 = (bool)(bVar17 >> 3 & 1);
              bVar11 = (bool)(bVar17 >> 4 & 1);
              bVar12 = (bool)(bVar17 >> 5 & 1);
              bVar13 = (bool)(bVar17 >> 6 & 1);
              *pfVar18 = (float)((uint)(bVar16 & 1) * auVar29._0_4_ |
                                (uint)!(bool)(bVar16 & 1) * (int)*pfVar18);
              pfVar18[1] = (float)((uint)bVar1 * auVar29._4_4_ | (uint)!bVar1 * (int)pfVar18[1]);
              pfVar18[2] = (float)((uint)bVar2 * auVar29._8_4_ | (uint)!bVar2 * (int)pfVar18[2]);
              pfVar18[3] = (float)((uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * (int)pfVar18[3]);
              pfVar18[4] = (float)((uint)bVar4 * auVar29._16_4_ | (uint)!bVar4 * (int)pfVar18[4]);
              pfVar18[5] = (float)((uint)bVar5 * auVar29._20_4_ | (uint)!bVar5 * (int)pfVar18[5]);
              pfVar18[6] = (float)((uint)bVar6 * auVar29._24_4_ | (uint)!bVar6 * (int)pfVar18[6]);
              pfVar18[7] = (float)((uint)bVar7 * auVar29._28_4_ | (uint)!bVar7 * (int)pfVar18[7]);
              pfVar18[8] = (float)((uint)(bVar17 & 1) * auVar29._32_4_ |
                                  (uint)!(bool)(bVar17 & 1) * (int)pfVar18[8]);
              pfVar18[9] = (float)((uint)bVar8 * auVar29._36_4_ | (uint)!bVar8 * (int)pfVar18[9]);
              pfVar18[10] = (float)((uint)bVar9 * auVar29._40_4_ | (uint)!bVar9 * (int)pfVar18[10]);
              pfVar18[0xb] = (float)((uint)bVar10 * auVar29._44_4_ |
                                    (uint)!bVar10 * (int)pfVar18[0xb]);
              pfVar18[0xc] = (float)((uint)bVar11 * auVar29._48_4_ |
                                    (uint)!bVar11 * (int)pfVar18[0xc]);
              pfVar18[0xd] = (float)((uint)bVar12 * auVar29._52_4_ |
                                    (uint)!bVar12 * (int)pfVar18[0xd]);
              pfVar18[0xe] = (float)((uint)bVar13 * auVar29._56_4_ |
                                    (uint)!bVar13 * (int)pfVar18[0xe]);
              pfVar18[0xf] = (float)((uint)(bVar17 >> 7) * auVar29._60_4_ |
                                    (uint)!(bool)(bVar17 >> 7) * (int)pfVar18[0xf]);
              uVar20 = uVar20 + 0x10;
            } while ((lVar23 + 0xfU & 0xfffffffffffffff0) != uVar20);
          }
          lVar21 = lVar21 + 1;
          pfVar19 = pfVar19 + lVar23;
        } while (lVar21 != lVar22);
      }
    }
  }
  else {
    if ((!add_to) && (lVar22 = dest->height, 0 < lVar22)) {
      pfVar19 = dest->ptr;
      lVar23 = dest->width;
      do {
        if (0 < lVar23) {
          memset(pfVar19,0,lVar23 * 4);
        }
        pfVar19 = pfVar19 + lVar23;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    if (!transpose) {
      default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                (dest,src->lhs,src->rhs);
      return;
    }
    local_70.data.data = (float *)src->rhs;
    local_50.op.m =
         (op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
          )src->lhs;
    default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
              (dest,(matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                     *)&local_70,&local_50);
  }
  return;
}

Assistant:

static void assign (
                dest_exp& dest,
                const matrix_multiply_exp<EXP1,EXP2>& src,
                typename src_exp::type alpha,
                bool add_to,
                bool transpose
            )
            {
                // At some point I need to improve the default (i.e. non BLAS) matrix 
                // multiplication algorithm...

                if (alpha == static_cast<typename src_exp::type>(1))
                {
                    if (add_to == false)
                    {
                        zero_matrix(dest);
                    }

                    if (transpose == false)
                        default_matrix_multiply(dest, src.lhs, src.rhs);
                    else
                        default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));
                }
                else
                {
                    if (add_to)
                    {
                        typename dest_exp::matrix_type temp(dest.nr(),dest.nc());
                        zero_matrix(temp);

                        if (transpose == false)
                            default_matrix_multiply(temp, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(temp, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,temp, alpha,true);
                    }
                    else
                    {
                        zero_matrix(dest);
                        
                        if (transpose == false)
                            default_matrix_multiply(dest, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,dest, alpha, false);
                    }
                }
            }